

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_type_array_stride_msl
          (CompilerMSL *this,SPIRType *type,bool is_packed,bool row_major)

{
  uint32_t uVar1;
  size_t sVar2;
  uint *puVar3;
  uint local_194;
  uint32_t local_190;
  uint local_18c;
  uint32_t array_size;
  uint32_t dim;
  uint32_t dimensions;
  uint32_t local_174;
  undefined1 local_170 [4];
  uint32_t value_size;
  SPIRType basic_type;
  bool row_major_local;
  bool is_packed_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  basic_type.member_name_cache._M_h._M_single_bucket._6_1_ = row_major;
  basic_type.member_name_cache._M_h._M_single_bucket._7_1_ = is_packed;
  SPIRType::SPIRType((SPIRType *)local_170,type);
  SmallVector<unsigned_int,_8UL>::clear((SmallVector<unsigned_int,_8UL> *)&basic_type.vecsize);
  SmallVector<bool,_8UL>::clear
            ((SmallVector<bool,_8UL> *)(basic_type.array.stack_storage.aligned_char + 0x18));
  local_174 = get_declared_type_size_msl
                        (this,(SPIRType *)local_170,
                         (bool)(basic_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1),
                         (bool)(basic_type.member_name_cache._M_h._M_single_bucket._6_1_ & 1));
  sVar2 = VectorView<unsigned_int>::size(&(type->array).super_VectorView<unsigned_int>);
  array_size = (uint32_t)sVar2;
  if (array_size != 0) {
    array_size = array_size - 1;
    for (local_18c = 0; uVar1 = local_174, local_18c < array_size; local_18c = local_18c + 1) {
      local_190 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type,local_18c);
      local_194 = 1;
      puVar3 = ::std::max<unsigned_int>(&local_190,&local_194);
      local_174 = *puVar3 * local_174;
    }
    SPIRType::~SPIRType((SPIRType *)local_170);
    return uVar1;
  }
  __assert_fail("dimensions > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                ,0x4263,
                "uint32_t spirv_cross::CompilerMSL::get_declared_type_array_stride_msl(const SPIRType &, bool, bool) const"
               );
}

Assistant:

uint32_t CompilerMSL::get_declared_type_array_stride_msl(const SPIRType &type, bool is_packed, bool row_major) const
{
	// Array stride in MSL is always size * array_size. sizeof(float3) == 16,
	// unlike GLSL and HLSL where array stride would be 16 and size 12.

	// We could use parent type here and recurse, but that makes creating physical type remappings
	// far more complicated. We'd rather just create the final type, and ignore having to create the entire type
	// hierarchy in order to compute this value, so make a temporary type on the stack.

	auto basic_type = type;
	basic_type.array.clear();
	basic_type.array_size_literal.clear();
	uint32_t value_size = get_declared_type_size_msl(basic_type, is_packed, row_major);

	uint32_t dimensions = uint32_t(type.array.size());
	assert(dimensions > 0);
	dimensions--;

	// Multiply together every dimension, except the last one.
	for (uint32_t dim = 0; dim < dimensions; dim++)
	{
		uint32_t array_size = to_array_size_literal(type, dim);
		value_size *= max<uint32_t>(array_size, 1u);
	}

	return value_size;
}